

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtwister.c
# Opt level: O2

unsigned_long genRandLong(MTRand *rand)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = rand->index;
  if ((ulong)uVar1 < 0x270) {
    uVar3 = rand->mt[uVar1];
    iVar2 = uVar1 + 1;
  }
  else {
    if (uVar1 != 0x270) {
      m_seedRand(rand,0x1105);
    }
    for (lVar4 = 0; lVar4 != 0xe3; lVar4 = lVar4 + 1) {
      uVar1 = (uint)rand->mt[lVar4 + 1];
      rand->mt[lVar4] =
           genRandLong::mag[uVar1 & 1] ^ rand->mt[lVar4 + 0x18d] ^
           (ulong)((uVar1 & 0x7ffffffe | (uint)rand->mt[lVar4] & 0x80000000) >> 1);
    }
    for (lVar4 = 0xe4; lVar4 != 0x270; lVar4 = lVar4 + 1) {
      uVar1 = (uint)rand->mt[lVar4];
      rand->mt[lVar4 + -1] =
           genRandLong::mag[uVar1 & 1] ^ *(ulong *)((long)rand + lVar4 * 8 + -0x720) ^
           (ulong)((uVar1 & 0x7ffffffe | (uint)rand->mt[lVar4 + -1] & 0x80000000) >> 1);
    }
    uVar3 = rand->mt[0];
    rand->mt[0x26f] =
         genRandLong::mag[(uint)uVar3 & 1] ^ rand->mt[0x18c] ^
         (ulong)(((uint)uVar3 & 0x7ffffffe | (uint)rand->mt[0x26f] & 0x80000000) >> 1);
    iVar2 = 1;
  }
  rand->index = iVar2;
  uVar3 = uVar3 >> 0xb ^ uVar3;
  uVar3 = ((uint)uVar3 & 0x13a58ad) << 7 ^ uVar3;
  uVar3 = ((uint)uVar3 & 0x1df8c) << 0xf ^ uVar3;
  return uVar3 >> 0x12 ^ uVar3;
}

Assistant:

unsigned long genRandLong(MTRand *rand) {

    unsigned long y;
    static unsigned long mag[2] = {0x0, 0x9908b0df}; /* mag[x] = x * 0x9908b0df for x = 0,1 */
    if (rand->index >= STATE_VECTOR_LENGTH || rand->index < 0) {
        /* generate STATE_VECTOR_LENGTH words at a time */
        int kk;
        if (rand->index >= STATE_VECTOR_LENGTH + 1 || rand->index < 0) {
            m_seedRand(rand, 4357);
        }
        for (kk = 0; kk < STATE_VECTOR_LENGTH - STATE_VECTOR_M; kk++) {
            y = (rand->mt[kk] & UPPER_MASK) | (rand->mt[kk + 1] & LOWER_MASK);
            rand->mt[kk] = rand->mt[kk + STATE_VECTOR_M] ^ (y >> 1) ^ mag[y & 0x1];
        }
        for (; kk < STATE_VECTOR_LENGTH - 1; kk++) {
            y = (rand->mt[kk] & UPPER_MASK) | (rand->mt[kk + 1] & LOWER_MASK);
            rand->mt[kk] = rand->mt[kk + (STATE_VECTOR_M - STATE_VECTOR_LENGTH)] ^ (y >> 1) ^ mag[y & 0x1];
        }
        y = (rand->mt[STATE_VECTOR_LENGTH - 1] & UPPER_MASK) | (rand->mt[0] & LOWER_MASK);
        rand->mt[STATE_VECTOR_LENGTH - 1] = rand->mt[STATE_VECTOR_M - 1] ^ (y >> 1) ^ mag[y & 0x1];
        rand->index = 0;
    }
    y = rand->mt[rand->index++];
    y ^= (y >> 11);
    y ^= (y << 7) & TEMPERING_MASK_B;
    y ^= (y << 15) & TEMPERING_MASK_C;
    y ^= (y >> 18);
    return y;
}